

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U>::runTest
          (ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *this,char *unrecognizedKey,
          char *proprietaryKey)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Message *actual_predicate_value;
  char *pcVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ktx_uint64_t levelOffset;
  ktx_uint32_t level;
  ktx_uint64_t offset;
  ktxLevelIndexEntry *levelIndex;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  ktx_uint32_t *dfd;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  KTX_header2 *header;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ktxHashListEntry *pWriter;
  uint32_t i;
  char rubbishValue [19];
  ktxHashList *hlists [2];
  ktxHashList *hl;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t kvDataLen;
  ktx_uint8_t *kvData;
  ktx_uint8_t *filePtr;
  ktx_size_t ktxMemFileLen;
  ktx_uint8_t *ktxMemFile;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffbe8) [38];
  KTX_header2 *in_stack_fffffffffffffbf0;
  texinfo *in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  int line;
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  Type TVar5;
  AssertHelper *in_stack_fffffffffffffc20;
  ktxTexture1 *in_stack_fffffffffffffc28;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffc30;
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  ktx_uint8_t *in_stack_fffffffffffffc60;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffc68;
  AssertHelper *in_stack_fffffffffffffc70;
  AssertionResult local_340 [2];
  undefined1 local_31a;
  undefined1 local_319;
  AssertionResult local_318 [2];
  AssertionResult local_2f8 [2];
  undefined4 local_2d4;
  ulong local_2d0;
  AssertionResult local_2c8;
  ulong local_2b8;
  uint local_2ac;
  ulong local_2a8;
  long local_2a0;
  undefined4 local_288;
  int local_284;
  AssertionResult local_280 [2];
  AssertionResult local_260 [2];
  undefined4 local_240;
  int local_23c;
  AssertionResult local_238;
  uint *local_228;
  undefined1 local_20a;
  undefined1 local_209;
  AssertionResult local_208 [2];
  undefined4 local_1e8;
  int local_1e4;
  AssertionResult local_1e0;
  void *local_1d0;
  string local_1c8 [40];
  char *local_1a0;
  undefined1 local_189;
  AssertionResult local_188 [2];
  undefined1 local_162;
  undefined1 local_161;
  AssertionResult local_160 [2];
  undefined4 local_13c;
  AssertionResult local_138;
  undefined8 local_128;
  uint local_11c;
  char local_118 [32];
  long local_f8 [3];
  uint local_dc;
  string local_d8 [40];
  undefined8 local_b0;
  undefined1 local_99;
  AssertionResult local_98 [3];
  undefined4 local_64;
  AssertionResult local_60;
  uint local_4c;
  void *local_48;
  void *local_40;
  undefined1 local_38 [8];
  void *local_30;
  ktx_error_code_e local_24;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24 = ktxTexture1_Create(in_RDI + 0x150,1,&local_20);
  local_64 = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             (ktx_error_code_e *)in_stack_fffffffffffffbf8,
             (ktx_error_code_e *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc20);
    testing::AssertionResult::failure_message((AssertionResult *)0x151e19);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               in_stack_fffffffffffffc00);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
    testing::Message::~Message((Message *)0x151e7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151eea);
  local_99 = local_20 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8,
             (type *)0x151f18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc20);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffbf0,(char (*) [28])in_stack_fffffffffffffbe8);
    local_b0 = ktxErrorString(local_24);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffc68,(char *)in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               in_stack_fffffffffffffc00);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x15204e);
  }
  local_dc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1520fb);
  if (local_dc == 0) {
    ktxHashList_Create(local_f8 + 2);
    local_f8[0] = local_20 + 0x50;
    local_f8[1] = local_f8[2];
    builtin_strncpy(local_118,"some rubbish value",0x13);
    for (local_11c = 0; local_11c < 2; local_11c = local_11c + 1) {
      in_stack_fffffffffffffc70 = (AssertHelper *)local_f8[local_11c];
      uVar2 = std::__cxx11::string::size();
      uVar3 = std::__cxx11::string::data();
      ktxHashList_AddKVPair(in_stack_fffffffffffffc70,"KTXwriter",uVar2,uVar3);
      if (local_10 != 0) {
        ktxHashList_AddKVPair(local_f8[local_11c],local_10,0x13,local_118);
      }
      if (local_18 != 0) {
        ktxHashList_AddKVPair(local_f8[local_11c],local_18,0x13,local_118);
      }
      ktxHashList_Sort(local_f8[local_11c]);
    }
    ktxHashList_FindEntry(local_f8[2],"KTXwriter",&local_128);
    appendLibId(local_f8[2],local_128);
    ktxHashList_Sort(local_f8[2]);
    ktxHashList_Serialize(local_f8[2],&local_4c,&local_48);
    ktxHashList_Destruct(local_f8[2]);
    local_24 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                         (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    local_13c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
               (ktx_error_code_e *)in_stack_fffffffffffffbf8,
               (ktx_error_code_e *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc20);
      in_stack_fffffffffffffc68 =
           (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x15238f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                 in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                 in_stack_fffffffffffffc00);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
      testing::Message::~Message((Message *)0x1523f2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x152460);
    local_161 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
                          (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    local_162 = 1;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,(bool *)in_stack_fffffffffffffbf8
               ,(bool *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc20);
      in_stack_fffffffffffffc60 =
           (ktx_uint8_t *)testing::AssertionResult::failure_message((AssertionResult *)0x1524ff);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                 in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                 in_stack_fffffffffffffc00);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
      testing::Message::~Message((Message *)0x15255c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1525cd);
    local_24 = ktxTexture1_WriteKTX2ToMemory(local_20,&local_30,local_38);
    TVar5 = (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    if (local_10 == 0) {
      local_189 = local_24 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8,
                 (type *)0x15262d);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        actual_predicate_value =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        pcVar4 = (char *)ktxErrorString(local_24);
        local_1a0 = pcVar4;
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffffc68,(char *)in_stack_fffffffffffffc60,
                   (char *)actual_predicate_value,pcVar4);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        std::__cxx11::string::~string(local_1c8);
        testing::Message::~Message((Message *)0x152751);
      }
      local_dc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1527fe);
      if (local_dc != 0) {
        return;
      }
      local_1d0 = local_30;
      local_1e4 = memcmp(local_30,(anonymous_namespace)::ktxId2,0xc);
      local_1e8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (int *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0x1528bc);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x152919);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15298a);
      local_209 = WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::compare
                            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      local_20a = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (bool *)in_stack_fffffffffffffbf8,(bool *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc38 =
             (WriterTestHelper<unsigned_char,_3U,_32849U> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x152a2c);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x152a89);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152afa);
      local_228 = (uint *)vk2dfd(*(undefined4 *)((long)local_1d0 + 0xc));
      local_23c = memcmp((void *)((long)local_30 + (ulong)*(uint *)((long)local_1d0 + 0x30)),
                         local_228,(ulong)*local_228);
      local_240 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (int *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc30 =
             (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x152bc4);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x152c21);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152c8f);
      local_40 = (void *)((long)local_30 + (ulong)*(uint *)((long)local_1d0 + 0x38));
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (uint *)in_stack_fffffffffffffbf8,(uint *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_260);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc28 =
             (ktxTexture1 *)testing::AssertionResult::failure_message((AssertionResult *)0x152d26);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x152d83);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152df4);
      local_284 = memcmp(local_40,local_48,(ulong)local_4c);
      local_288 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (int *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc20 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x152e95);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x152ef2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152f63);
      local_40 = (void *)((long)local_40 + (ulong)*(uint *)(in_RDI + 0x38));
      local_2a0 = (long)local_30 + 0x50;
      local_2a8 = 0xffffffffffffffff;
      for (local_2ac = 0; TVar5 = (Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
          local_2ac < *(uint *)(in_RDI + 0x10); local_2ac = local_2ac + 1) {
        local_2b8 = *(ulong *)(local_2a0 + (ulong)local_2ac * 0x18);
        local_2d0 = local_2b8 % (ulong)*(uint *)(in_RDI + 0x180);
        local_2d4 = 0;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                   (unsigned_long *)in_stack_fffffffffffffbf8,(uint *)in_stack_fffffffffffffbf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc20);
          in_stack_fffffffffffffc18 =
               testing::AssertionResult::failure_message((AssertionResult *)0x153086);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                     in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     in_stack_fffffffffffffc00);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
          testing::Message::~Message((Message *)0x1530e3);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x153151);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                   (unsigned_long *)in_stack_fffffffffffffbf8,
                   (unsigned_long *)in_stack_fffffffffffffbf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc20);
          in_stack_fffffffffffffc10 =
               testing::AssertionResult::failure_message((AssertionResult *)0x1531c2);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc20,(Type)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                     in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     in_stack_fffffffffffffc00);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
          testing::Message::~Message((Message *)0x15321f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x15328a);
        local_2a8 = local_2b8;
      }
      local_319 = WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
                            (in_stack_fffffffffffffc38,
                             (ktxLevelIndexEntry *)in_stack_fffffffffffffc30,
                             (ktx_uint8_t *)in_stack_fffffffffffffc28);
      local_31a = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (bool *)in_stack_fffffffffffffbf8,(bool *)in_stack_fffffffffffffbf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_318);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x153353);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,TVar5,in_stack_fffffffffffffc10,
                   (int)((ulong)pcVar4 >> 0x20),in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x1533b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15341b);
      if (local_30 != (void *)0x0) {
        operator_delete(local_30,1);
      }
    }
    else {
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                 (ktx_error_code_e *)in_stack_fffffffffffffbf8,
                 (ktx_error_code_e *)in_stack_fffffffffffffbf0);
      line = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc20);
        testing::AssertionResult::failure_message((AssertionResult *)0x1534be);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc20,TVar5,in_stack_fffffffffffffc10,line,
                   in_stack_fffffffffffffc00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
        testing::Message::~Message((Message *)0x15351b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x153586);
    }
    (*(code *)**(undefined8 **)(local_20 + 8))(local_20);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,1);
    }
  }
  return;
}

Assistant:

void runTest(const char* unrecognizedKey, const char* proprietaryKey) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;
        ktx_uint8_t* kvData;
        ktx_uint32_t kvDataLen;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        ktxHashList* hl;
        ktxHashList_Create(&hl);
        ktxHashList* hlists[2] = {&texture->kvDataHead, hl};
        // Add desired keys & values to both the texture and a comparator.
        char rubbishValue[] = "some rubbish value";
        for (uint32_t i = 0; i < 2; i++) {
            // N.B. Writer metadata is not legal in a KTX v1 file but we know
            // we're going to write this out as a v2 file so okay.
            ktxHashList_AddKVPair(hlists[i], KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
            if (unrecognizedKey) {
                ktxHashList_AddKVPair(hlists[i], unrecognizedKey,
                                      sizeof(rubbishValue),
                                      rubbishValue);
            }
            if (proprietaryKey) {
                ktxHashList_AddKVPair(hlists[i], proprietaryKey,
                                      sizeof(rubbishValue),
                                      rubbishValue);
            }
            ktxHashList_Sort(hlists[i]);
        }
        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(hl, KTX_WRITER_KEY, &pWriter);
        appendLibId(hl, pWriter);
        ktxHashList_Sort(hl);
        ktxHashList_Serialize(hl, &kvDataLen, &kvData);
        ktxHashList_Destruct(hl);

        result = helper.copyImagesToTexture(texture);
        EXPECT_EQ(result, KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);

        result = ktxTexture1_WriteKTX2ToMemory(texture,
                                               &ktxMemFile,
                                               &ktxMemFileLen);

        if (unrecognizedKey == NULL) {
            ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteKTX2ToMemory failed: "
                                               << ktxErrorString(result);

            KTX_header2* header = (KTX_header2*)ktxMemFile;

            EXPECT_EQ(memcmp(header, ktxId2, sizeof(ktxId2)), 0);
            EXPECT_EQ(helper.texinfo.compare(header), true);

            // Check the format descriptor.
            ktx_uint32_t* dfd = vk2dfd(static_cast<VkFormat>(header->vkFormat));
            EXPECT_EQ(memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset,
                             dfd,
                             *dfd), 0);

            // Check the metadata.
            filePtr = ktxMemFile + header->keyValueData.byteOffset;
            EXPECT_EQ(header->keyValueData.byteLength, kvDataLen);
            EXPECT_EQ(memcmp(filePtr, kvData, kvDataLen), 0);
            filePtr += helper.kvDataLen;

            // Offset of level 0 is first item in leveIndex after header.
            ktxLevelIndexEntry* levelIndex =
                reinterpret_cast<ktxLevelIndexEntry*>(ktxMemFile + sizeof(*header));

            ktx_uint64_t offset = UINT64_MAX;
            for (ktx_uint32_t level = 0; level < helper.numLevels; level++) {
                ktx_uint64_t levelOffset = levelIndex[level].byteOffset;
                // Check offset is properly aligned.
                EXPECT_EQ(levelOffset % requiredLevelAlignment, 0U);
                // Check mipmaps are in order of increasing size in the file
                // therefore each offset should be smaller than the previous.
                EXPECT_LE(levelOffset, offset);
                offset = levelOffset;
            }

            EXPECT_EQ(helper.compareRawImages(levelIndex, ktxMemFile), true);

            delete ktxMemFile;
        } else {
            EXPECT_EQ(result, KTX_INVALID_OPERATION);
        }

        ktxTexture_Destroy(ktxTexture(texture));
        delete kvData;

    }